

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

SUNErrCode erkStep_SUNStepperReInit(SUNStepper_conflict stepper,sunrealtype t0,N_Vector y0)

{
  int iVar1;
  ARKRhsFn in_RSI;
  long in_RDI;
  void *in_XMM0_Qa;
  int retval;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  void *arkode_mem;
  SUNContext_conflict sunctx_local_scope_;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  ARKodeMem in_stack_ffffffffffffffc8;
  N_Vector in_stack_ffffffffffffffd0;
  sunrealtype t0_00;
  SUNErrCode local_4;
  
  t0_00 = *(sunrealtype *)(in_RDI + 0x10);
  SUNStepper_GetContent(in_RDI,&stack0xffffffffffffffd0);
  iVar1 = erkStep_AccessARKODEStepMem
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (ARKodeERKStepMem *)0x153d2c);
  if (iVar1 == 0) {
    iVar1 = ERKStepReInit(in_XMM0_Qa,in_RSI,t0_00,in_stack_ffffffffffffffd0);
    *(int *)(in_RDI + 0x18) = iVar1;
    if (*(int *)(in_RDI + 0x18) == 0) {
      local_4 = 0;
    }
    else {
      arkProcessError(in_stack_ffffffffffffffc8,(int)(ulong)*(uint *)(in_RDI + 0x18),0x69d,
                      "erkStep_SUNStepperReInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                      ,"ERKStepReInit return an error\n");
      local_4 = -0x2706;
    }
  }
  else {
    arkProcessError((ARKodeMem)0x0,-0x16,0x695,"erkStep_SUNStepperReInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"The ARKStep memory pointer is NULL");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

static SUNErrCode erkStep_SUNStepperReInit(SUNStepper stepper, sunrealtype t0,
                                           N_Vector y0)
{
  SUNFunctionBegin(stepper->sunctx);

  void* arkode_mem;
  SUNCheckCall(SUNStepper_GetContent(stepper, &arkode_mem));

  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval = erkStep_AccessARKODEStepMem(arkode_mem, "erkStepSUNStepperReInit",
                                           &ark_mem, &step_mem);
  if (retval)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The ARKStep memory pointer is NULL");
    return ARK_ILL_INPUT;
  }

  stepper->last_flag = ERKStepReInit(arkode_mem, step_mem->f, t0, y0);
  if (stepper->last_flag != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, stepper->last_flag, __LINE__, __func__, __FILE__,
                    "ERKStepReInit return an error\n");
    return SUN_ERR_OP_FAIL;
  }

  return SUN_SUCCESS;
}